

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Nonlin.c
# Opt level: O3

int Llb_Nonlin4Reachability(Llb_Mnx_t *p)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  DdNode *pDVar4;
  DdNode *pDVar5;
  void **ppvVar6;
  Gia_ParLlb_t *pGVar7;
  Vec_Ptr_t *pVVar8;
  Abc_Cex_t *pAVar9;
  abctime aVar10;
  int fVerbose;
  long lVar11;
  abctime time;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  DdManager *pDVar15;
  char *pcVar16;
  Aig_Man_t *pAVar17;
  long lVar18;
  double dVar19;
  timespec ts;
  timespec local_60;
  uint local_50;
  uint local_4c;
  double local_48;
  double local_40;
  long local_38;
  
  iVar1 = clock_gettime(3,&local_60);
  if (iVar1 < 0) {
    lVar18 = -1;
  }
  else {
    lVar18 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
  }
  pAVar17 = p->pAig;
  if (pAVar17->nRegs < 1) {
    __assert_fail("Aig_ManRegNum(p->pAig) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/llb/llb4Nonlin.c"
                  ,0x2a3,"int Llb_Nonlin4Reachability(Llb_Mnx_t *)");
  }
  pGVar7 = p->pPars;
  if (pGVar7->fBackward == 0) {
    if (pGVar7->fSkipOutCheck == 0) {
      pDVar15 = p->dd;
      if (pGVar7->fCluster != 0) {
        p->bBad = pDVar15->bFunc;
        goto LAB_00839137;
      }
      pDVar4 = Llb_Nonlin4ComputeBad(pDVar15,pAVar17,p->vOrder);
      p->bBad = pDVar4;
      if (pDVar4 == (DdNode *)0x0) goto LAB_0083986c;
      Cudd_Ref(pDVar4);
      pDVar15 = p->dd;
    }
    else {
      pDVar15 = p->dd;
      if (pDVar15->bFunc != (DdNode *)0x0) {
        Cudd_RecursiveDeref(pDVar15,pDVar15->bFunc);
        pDVar15 = p->dd;
LAB_00839137:
        pDVar15->bFunc = (DdNode *)0x0;
      }
    }
    pDVar4 = Llb_Nonlin4ComputeInitState(pDVar15,p->pAig,p->vOrder,p->pPars->fBackward);
    p->bCurrent = pDVar4;
    Cudd_Ref(pDVar4);
LAB_00839161:
    p->bReached = p->bCurrent;
    local_38 = lVar18;
    Cudd_Ref(p->bCurrent);
    pGVar7 = p->pPars;
    if (pGVar7->nIterMax < 1) {
      uVar12 = 0;
    }
    else {
      uVar12 = 0;
      local_50 = 0;
      local_4c = 0;
      local_48 = (double)((ulong)local_48 & 0xffffffff00000000);
      do {
        iVar1 = clock_gettime(3,&local_60);
        if (iVar1 < 0) {
          lVar18 = 1;
        }
        else {
          lVar18 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_60.tv_nsec),8);
          lVar18 = ((lVar18 >> 7) - (lVar18 >> 0x3f)) + local_60.tv_sec * -1000000;
        }
        if (p->pPars->TimeLimit != 0) {
          iVar1 = clock_gettime(3,&local_60);
          if (iVar1 < 0) {
            lVar11 = -1;
          }
          else {
            lVar11 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
          }
          pGVar7 = p->pPars;
          if (lVar11 <= pGVar7->TimeTarget) goto LAB_00839243;
          if (pGVar7->fSilent == 0) {
            uVar13 = (ulong)(uint)pGVar7->TimeLimit;
            pcVar16 = "Reached timeout (%d seconds) during image computation.\n";
            goto LAB_008398f4;
          }
LAB_008398ff:
          uVar12 = uVar12 - 1;
LAB_00839901:
          pGVar7->iFrame = uVar12;
          return -1;
        }
LAB_00839243:
        pDVar4 = p->bCurrent;
        pVVar8 = p->vRings;
        uVar2 = pVVar8->nSize;
        local_40 = (double)lVar18;
        if (uVar2 == pVVar8->nCap) {
          if ((int)uVar2 < 0x10) {
            if (pVVar8->pArray == (void **)0x0) {
              ppvVar6 = (void **)malloc(0x80);
            }
            else {
              ppvVar6 = (void **)realloc(pVVar8->pArray,0x80);
            }
            pVVar8->pArray = ppvVar6;
            pVVar8->nCap = 0x10;
          }
          else {
            if (pVVar8->pArray == (void **)0x0) {
              ppvVar6 = (void **)malloc((ulong)uVar2 << 4);
            }
            else {
              ppvVar6 = (void **)realloc(pVVar8->pArray,(ulong)uVar2 << 4);
            }
            pVVar8->pArray = ppvVar6;
            pVVar8->nCap = uVar2 * 2;
          }
        }
        else {
          ppvVar6 = pVVar8->pArray;
        }
        iVar1 = pVVar8->nSize;
        pVVar8->nSize = iVar1 + 1;
        ppvVar6[iVar1] = pDVar4;
        Cudd_Ref(p->bCurrent);
        if ((p->pPars->fSkipOutCheck == 0) &&
           (iVar1 = Cudd_bddLeq(p->dd,p->bCurrent,(DdNode *)((ulong)p->bBad ^ 1)), iVar1 == 0)) {
          if (p->pAig->pSeqModel != (Abc_Cex_t *)0x0) {
            __assert_fail("p->pAig->pSeqModel == NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/llb/llb4Nonlin.c"
                          ,0x2f6,"int Llb_Nonlin4Reachability(Llb_Mnx_t *)");
          }
          pVVar8 = Llb_Nonlin4DeriveCex(p,p->pPars->fBackward,fVerbose);
          pAVar17 = p->pAig;
          pAVar9 = Llb4_Nonlin4TransformCex(pAVar17,pVVar8,-1,p->pPars->fVerbose);
          iVar1 = (int)pAVar17;
          p->pAig->pSeqModel = pAVar9;
          if (pVVar8 != (Vec_Ptr_t *)0x0) {
            if (pVVar8->pArray != (void **)0x0) {
              free(pVVar8->pArray);
            }
            free(pVVar8);
            iVar1 = (int)pVVar8;
          }
          pGVar7 = p->pPars;
          if (pGVar7->fSilent == 0) {
            Abc_Print(iVar1,"Output %d of miter \"%s\" was asserted in frame %d.  ",
                      (ulong)(uint)p->pAig->pSeqModel->iPo,p->pAig->pName,(ulong)uVar12);
            aVar10 = Abc_Clock();
            Abc_PrintTime(0x94cc3c,(char *)(aVar10 - local_38),time);
            pGVar7 = p->pPars;
          }
          pGVar7->iFrame = uVar12 - 1;
          return 0;
        }
        iVar1 = clock_gettime(3,&local_60);
        if (iVar1 < 0) {
          lVar18 = 1;
        }
        else {
          lVar18 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_60.tv_nsec),8);
          lVar18 = ((lVar18 >> 7) - (lVar18 >> 0x3f)) + local_60.tv_sec * -1000000;
        }
        pDVar4 = Llb_Nonlin4Image(p->dd,p->vRoots,p->bCurrent,p->vVars2Q);
        p->bNext = pDVar4;
        if (pDVar4 == (DdNode *)0x0) {
          pGVar7 = p->pPars;
          if (pGVar7->fSilent == 0) {
            uVar13 = (ulong)(uint)pGVar7->TimeLimit;
            pcVar16 = "Reached timeout (%d seconds) during image computation in quantification.\n";
LAB_008398f4:
            printf(pcVar16,uVar13);
            pGVar7 = p->pPars;
          }
          goto LAB_008398ff;
        }
        Cudd_Ref(pDVar4);
        iVar1 = clock_gettime(3,&local_60);
        if (iVar1 < 0) {
          lVar11 = -1;
        }
        else {
          lVar11 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
        }
        p->timeImage = p->timeImage + lVar11 + lVar18;
        iVar1 = clock_gettime(3,&local_60);
        if (iVar1 < 0) {
          lVar18 = 1;
        }
        else {
          lVar18 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_60.tv_nsec),8);
          lVar18 = ((lVar18 >> 7) - (lVar18 >> 0x3f)) + local_60.tv_sec * -1000000;
        }
        pDVar4 = p->bNext;
        pDVar5 = Cudd_bddVarMap(p->dd,pDVar4);
        p->bNext = pDVar5;
        if (pDVar5 == (DdNode *)0x0) {
          if (p->pPars->fSilent == 0) {
            printf("Reached timeout (%d seconds) during remapping next states.\n",
                   (ulong)(uint)p->pPars->TimeLimit);
          }
          Cudd_RecursiveDeref(p->dd,pDVar4);
          uVar12 = uVar12 - 1;
LAB_008398c8:
          pGVar7 = p->pPars;
          goto LAB_00839901;
        }
        Cudd_Ref(pDVar5);
        Cudd_RecursiveDeref(p->dd,pDVar4);
        iVar1 = clock_gettime(3,&local_60);
        if (iVar1 < 0) {
          lVar11 = -1;
        }
        else {
          lVar11 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
        }
        p->timeRemap = p->timeRemap + lVar11 + lVar18;
        if (p->pPars->fVerbose != 0) {
          iVar1 = Cudd_DagSize(p->bCurrent);
          local_48 = (double)CONCAT44(local_48._4_4_,iVar1);
          local_4c = Cudd_DagSize(pDVar4);
          local_50 = Cudd_DagSize(p->bNext);
        }
        Cudd_RecursiveDeref(p->dd,p->bCurrent);
        p->bCurrent = (DdNode *)0x0;
        pDVar4 = Cudd_bddAnd(p->dd,p->bNext,(DdNode *)((ulong)p->bReached ^ 1));
        p->bCurrent = pDVar4;
        if (pDVar4 == (DdNode *)0x0) {
          pGVar7 = p->pPars;
          if (pGVar7->fSilent == 0) {
            uVar13 = (ulong)(uint)pGVar7->TimeLimit;
            pcVar16 = "Reached timeout (%d seconds) during image computation in transfer 1.\n";
            goto LAB_008398f4;
          }
          goto LAB_008398ff;
        }
        Cudd_Ref(pDVar4);
        Cudd_RecursiveDeref(p->dd,p->bNext);
        p->bNext = (DdNode *)0x0;
        if (*(int *)((ulong)p->bCurrent & 0xfffffffffffffffe) == 0x7fffffff) {
          pGVar7 = p->pPars;
          break;
        }
        pDVar4 = p->bReached;
        pDVar5 = Cudd_bddOr(p->dd,pDVar4,p->bCurrent);
        p->bReached = pDVar5;
        if (pDVar5 == (DdNode *)0x0) {
          pGVar7 = p->pPars;
          if (pGVar7->fSilent == 0) {
            printf("Reached timeout (%d seconds) during image computation in transfer 1.\n",
                   (ulong)(uint)pGVar7->TimeLimit);
            pGVar7 = p->pPars;
          }
          pGVar7->iFrame = uVar12 - 1;
          Cudd_RecursiveDeref(p->dd,pDVar4);
          return -1;
        }
        Cudd_Ref(pDVar5);
        Cudd_RecursiveDeref(p->dd,pDVar4);
        pGVar7 = p->pPars;
        if (pGVar7->fVerbose != 0) {
          printf("I =%5d : ",(ulong)uVar12);
          printf("Fr =%7d  ",(ulong)local_48 & 0xffffffff);
          printf("ImNs =%7d  ",(ulong)local_4c);
          printf("ImCs =%7d  ",(ulong)local_50);
          uVar2 = Cudd_DagSize(p->bReached);
          printf("Rea =%7d   ",(ulong)uVar2);
          uVar2 = Cudd_ReadReorderings(p->dd);
          uVar3 = Cudd_ReadGarbageCollections(p->dd);
          printf("(%4d %4d)  ",(ulong)uVar2,(ulong)uVar3);
          iVar14 = 3;
          iVar1 = clock_gettime(3,&local_60);
          if (iVar1 < 0) {
            lVar18 = -1;
          }
          else {
            lVar18 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
          }
          lVar18 = lVar18 + (long)local_40;
          Abc_Print(iVar14,"%s =","T");
          Abc_Print(iVar14,"%9.2f sec\n",(double)lVar18 / 1000000.0);
          pGVar7 = p->pPars;
        }
        if (uVar12 == pGVar7->nIterMax - 1U) {
          if (pGVar7->fSilent != 0) goto LAB_00839901;
          printf("Reached limit on the number of timeframes (%d).\n");
          goto LAB_008398c8;
        }
        uVar12 = uVar12 + 1;
      } while ((int)uVar12 < pGVar7->nIterMax);
    }
    if (pGVar7->fVerbose != 0) {
      local_40 = Cudd_CountMinterm(p->dd,p->bReached,p->pAig->nRegs);
      if ((p->bCurrent == (DdNode *)0x0) ||
         (*(int *)((ulong)p->bCurrent & 0xfffffffffffffffe) != 0x7fffffff)) {
        pcVar16 = "Reachability analysis is stopped after %d frames.\n";
      }
      else {
        pcVar16 = "Reachability analysis completed after %d frames.\n";
      }
      printf(pcVar16,(ulong)uVar12);
      local_48 = local_40 * 100.0;
      dVar19 = ldexp(1.0,p->pAig->nRegs);
      printf("Reachable states = %.0f. (Ratio = %.4f %%)\n",local_40,local_48 / dVar19);
      fflush(_stdout);
    }
    if (p->bCurrent == (DdNode *)0x0) {
      pGVar7 = p->pPars;
    }
    else {
      pGVar7 = p->pPars;
      if (*(int *)((ulong)p->bCurrent & 0xfffffffffffffffe) == 0x7fffffff) {
        if (pGVar7->fSilent == 0) {
          printf("The miter is proved unreachable after %d iterations.  ",(ulong)uVar12);
          pGVar7 = p->pPars;
          if (pGVar7->fSilent == 0) {
            iVar14 = 3;
            iVar1 = clock_gettime(3,&local_60);
            if (iVar1 < 0) {
              lVar18 = -1;
            }
            else {
              lVar18 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
            }
            lVar18 = lVar18 - local_38;
            Abc_Print(iVar14,"%s =","Time");
            Abc_Print(iVar14,"%9.2f sec\n",(double)lVar18 / 1000000.0);
            pGVar7 = p->pPars;
          }
        }
        pGVar7->iFrame = uVar12 - 1;
        return 1;
      }
    }
    if (pGVar7->fSilent == 0) {
      printf("Verified only for states reachable in %d frames.  ",(ulong)uVar12);
      pGVar7 = p->pPars;
    }
    pGVar7->iFrame = pGVar7->nIterMax;
  }
  else {
    if (pGVar7->fSkipOutCheck == 0) {
      pDVar4 = Llb_Nonlin4ComputeInitState(p->dd,pAVar17,p->vOrder,pGVar7->fBackward);
      p->bBad = pDVar4;
      Cudd_Ref(pDVar4);
      pGVar7 = p->pPars;
    }
    pDVar15 = p->dd;
    if (pGVar7->fCluster == 0) {
      pDVar4 = Llb_Nonlin4ComputeBad(pDVar15,p->pAig,p->vOrder);
      p->bCurrent = pDVar4;
      if (pDVar4 != (DdNode *)0x0) {
        Cudd_Ref(pDVar4);
        pDVar15 = p->dd;
        pDVar4 = p->bCurrent;
        goto LAB_008390c7;
      }
LAB_0083986c:
      pGVar7 = p->pPars;
      if (pGVar7->fSilent == 0) {
        printf("Reached timeout (%d seconds) during constructing the bad states.\n",
               (ulong)(uint)pGVar7->TimeLimit);
        goto LAB_00839115;
      }
    }
    else {
      pDVar4 = pDVar15->bFunc;
      p->bCurrent = pDVar4;
      pDVar15->bFunc = (DdNode *)0x0;
LAB_008390c7:
      pDVar5 = Cudd_bddVarMap(pDVar15,pDVar4);
      p->bCurrent = pDVar5;
      if (pDVar5 != (DdNode *)0x0) {
        Cudd_Ref(pDVar5);
        Cudd_RecursiveDeref(p->dd,pDVar4);
        goto LAB_00839161;
      }
      if (p->pPars->fSilent == 0) {
        printf("Reached timeout (%d seconds) during remapping bad states.\n",
               (ulong)(uint)p->pPars->TimeLimit);
      }
      Cudd_RecursiveDeref(p->dd,pDVar4);
LAB_00839115:
      pGVar7 = p->pPars;
    }
    pGVar7->iFrame = -1;
  }
  return -1;
}

Assistant:

int Llb_Nonlin4Reachability( Llb_Mnx_t * p )
{ 
    DdNode * bAux;
    int nIters, nBddSizeFr = 0, nBddSizeTo = 0, nBddSizeTo2 = 0;
    abctime clkTemp, clkIter, clk = Abc_Clock();
    assert( Aig_ManRegNum(p->pAig) > 0 );

    if ( p->pPars->fBackward )
    {
        // create bad state in the ring manager
        if ( !p->pPars->fSkipOutCheck )
        {
            p->bBad = Llb_Nonlin4ComputeInitState( p->dd, p->pAig, p->vOrder, p->pPars->fBackward );  Cudd_Ref( p->bBad );
        }
        // create init state
        if ( p->pPars->fCluster )
            p->bCurrent = p->dd->bFunc, p->dd->bFunc = NULL; 
        else
        {
            p->bCurrent = Llb_Nonlin4ComputeBad( p->dd, p->pAig, p->vOrder );          
            if ( p->bCurrent == NULL )
            {
                if ( !p->pPars->fSilent )
                    printf( "Reached timeout (%d seconds) during constructing the bad states.\n", p->pPars->TimeLimit );
                p->pPars->iFrame = -1;
                return -1;
            }
            Cudd_Ref( p->bCurrent );
        }
        // remap into the next states
        p->bCurrent = Cudd_bddVarMap( p->dd, bAux = p->bCurrent );
        if ( p->bCurrent == NULL )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached timeout (%d seconds) during remapping bad states.\n",  p->pPars->TimeLimit );
            Cudd_RecursiveDeref( p->dd, bAux );
            p->pPars->iFrame = -1;
            return -1;
        }
        Cudd_Ref( p->bCurrent );
        Cudd_RecursiveDeref( p->dd, bAux );
    }
    else
    {
        // create bad state in the ring manager
        if ( !p->pPars->fSkipOutCheck )
        {
            if ( p->pPars->fCluster )
                p->bBad = p->dd->bFunc, p->dd->bFunc = NULL; 
            else
            {
                p->bBad = Llb_Nonlin4ComputeBad( p->dd, p->pAig, p->vOrder );          
                if ( p->bBad == NULL )
                {
                    if ( !p->pPars->fSilent )
                        printf( "Reached timeout (%d seconds) during constructing the bad states.\n", p->pPars->TimeLimit );
                    p->pPars->iFrame = -1;
                    return -1;
                }
                Cudd_Ref( p->bBad );
            }
        }
        else if ( p->dd->bFunc )
            Cudd_RecursiveDeref( p->dd, p->dd->bFunc ), p->dd->bFunc = NULL;
        // compute the starting set of states
        p->bCurrent = Llb_Nonlin4ComputeInitState( p->dd, p->pAig, p->vOrder, p->pPars->fBackward );  Cudd_Ref( p->bCurrent );
    }
    // perform iterations
    p->bReached = p->bCurrent; Cudd_Ref( p->bReached );
    for ( nIters = 0; nIters < p->pPars->nIterMax; nIters++ )
    { 
        clkIter = Abc_Clock();
        // check the runtime limit
        if ( p->pPars->TimeLimit && Abc_Clock() > p->pPars->TimeTarget )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached timeout (%d seconds) during image computation.\n",  p->pPars->TimeLimit );
            p->pPars->iFrame = nIters - 1;
            return -1;
        }

        // save the onion ring
        Vec_PtrPush( p->vRings, p->bCurrent );   Cudd_Ref( p->bCurrent );

        // check it for bad states
        if ( !p->pPars->fSkipOutCheck && !Cudd_bddLeq( p->dd, p->bCurrent, Cudd_Not(p->bBad) ) ) 
        {
            Vec_Ptr_t * vStates;
            assert( p->pAig->pSeqModel == NULL );
            vStates = Llb_Nonlin4DeriveCex( p, p->pPars->fBackward, p->pPars->fVerbose ); 
            p->pAig->pSeqModel = Llb4_Nonlin4TransformCex( p->pAig, vStates, -1, p->pPars->fVerbose );
            Vec_PtrFreeP( &vStates );
            if ( !p->pPars->fSilent )
            {
                Abc_Print( 1, "Output %d of miter \"%s\" was asserted in frame %d.  ", p->pAig->pSeqModel->iPo, p->pAig->pName, nIters );
                Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
            }
            p->pPars->iFrame = nIters - 1;
            return 0;
        }

        // compute the next states
        clkTemp = Abc_Clock();
        p->bNext = Llb_Nonlin4Image( p->dd, p->vRoots, p->bCurrent, p->vVars2Q );
        if ( p->bNext == NULL )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached timeout (%d seconds) during image computation in quantification.\n",  p->pPars->TimeLimit );
            p->pPars->iFrame = nIters - 1;
            return -1;
        }
        Cudd_Ref( p->bNext );
        p->timeImage += Abc_Clock() - clkTemp;

        // remap into current states
        clkTemp = Abc_Clock();
        p->bNext = Cudd_bddVarMap( p->dd, bAux = p->bNext );
        if ( p->bNext == NULL )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached timeout (%d seconds) during remapping next states.\n",  p->pPars->TimeLimit );
            Cudd_RecursiveDeref( p->dd, bAux );
            p->pPars->iFrame = nIters - 1;
            return -1;
        }
        Cudd_Ref( p->bNext );
        Cudd_RecursiveDeref( p->dd, bAux );
        p->timeRemap += Abc_Clock() - clkTemp;

        // collect statistics
        if ( p->pPars->fVerbose )
        {
            nBddSizeFr  = Cudd_DagSize( p->bCurrent );
            nBddSizeTo  = Cudd_DagSize( bAux );
            nBddSizeTo2 = Cudd_DagSize( p->bNext );
        }
        Cudd_RecursiveDeref( p->dd, p->bCurrent ); p->bCurrent = NULL;

        // derive new states
        p->bCurrent = Cudd_bddAnd( p->dd, p->bNext, Cudd_Not(p->bReached) );     
        if ( p->bCurrent == NULL )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached timeout (%d seconds) during image computation in transfer 1.\n",  p->pPars->TimeLimit );
            p->pPars->iFrame = nIters - 1;
            return -1;
        }
        Cudd_Ref( p->bCurrent );
        Cudd_RecursiveDeref( p->dd, p->bNext ); p->bNext = NULL;
        if ( Cudd_IsConstant(p->bCurrent) )
            break;
/*
        // reduce BDD size using constrain // Cudd_bddRestrict
        p->bCurrent = Cudd_bddRestrict( p->dd, bAux = p->bCurrent, Cudd_Not(p->bReached) );   
        Cudd_Ref( p->bCurrent );
printf( "Before = %d.  After = %d.\n", Cudd_DagSize(bAux), Cudd_DagSize(p->bCurrent) );
        Cudd_RecursiveDeref( p->dd, bAux );
*/

        // add to the reached set
        p->bReached = Cudd_bddOr( p->dd, bAux = p->bReached, p->bCurrent );                 
        if ( p->bReached == NULL )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached timeout (%d seconds) during image computation in transfer 1.\n",  p->pPars->TimeLimit );
            p->pPars->iFrame = nIters - 1;
            Cudd_RecursiveDeref( p->dd, bAux );  
            return -1;
        }
        Cudd_Ref( p->bReached );
        Cudd_RecursiveDeref( p->dd, bAux );  


        // report the results
        if ( p->pPars->fVerbose )
        {
            printf( "I =%5d : ",   nIters );
            printf( "Fr =%7d  ",   nBddSizeFr );
            printf( "ImNs =%7d  ", nBddSizeTo );
            printf( "ImCs =%7d  ", nBddSizeTo2 );
            printf( "Rea =%7d   ", Cudd_DagSize(p->bReached) );
            printf( "(%4d %4d)  ", Cudd_ReadReorderings(p->dd), Cudd_ReadGarbageCollections(p->dd) );
            Abc_PrintTime( 1, "T", Abc_Clock() - clkIter );
        }
/*
        if ( pPars->fVerbose )
        {
            double nMints = Cudd_CountMinterm(p->dd, bReached, Saig_ManRegNum(p->pAig) );
//            Extra_bddPrint( p->dd, bReached );printf( "\n" );
            printf( "Reachable states = %.0f. (Ratio = %.4f %%)\n", nMints, 100.0*nMints/pow(2.0, Saig_ManRegNum(p->pAig)) );
            fflush( stdout ); 
        }
*/
        if ( nIters == p->pPars->nIterMax - 1 )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached limit on the number of timeframes (%d).\n",  p->pPars->nIterMax );
            p->pPars->iFrame = nIters;
            return -1;
        }
    }
    
    // report the stats
    if ( p->pPars->fVerbose )
    {
        double nMints = Cudd_CountMinterm(p->dd, p->bReached, Saig_ManRegNum(p->pAig) );
        if ( p->bCurrent && Cudd_IsConstant(p->bCurrent) )
            printf( "Reachability analysis completed after %d frames.\n", nIters );
        else
            printf( "Reachability analysis is stopped after %d frames.\n", nIters );
        printf( "Reachable states = %.0f. (Ratio = %.4f %%)\n", nMints, 100.0*nMints/pow(2.0, Saig_ManRegNum(p->pAig)) );
        fflush( stdout ); 
    }
    if ( p->bCurrent == NULL || !Cudd_IsConstant(p->bCurrent) )
    {
        if ( !p->pPars->fSilent )
            printf( "Verified only for states reachable in %d frames.  ", nIters );
        p->pPars->iFrame = p->pPars->nIterMax;
        return -1; // undecided
    }
    // report
    if ( !p->pPars->fSilent )
        printf( "The miter is proved unreachable after %d iterations.  ", nIters );
    if ( !p->pPars->fSilent )
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    p->pPars->iFrame = nIters - 1;
    return 1; // unreachable
}